

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip.c
# Opt level: O1

void test_write_format_zip_winzip_aes256_encryption(void)

{
  int iVar1;
  void *buff;
  archive *paVar2;
  size_t used;
  size_t local_38;
  
  buff = malloc(1000000);
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'͙',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'͚',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'͛',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_set_options(paVar2,"zip:encryption=aes256");
  if (iVar1 == 0) {
    iVar1 = archive_write_set_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͤ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_passphrase(a, \"password1234\")",paVar2);
    iVar1 = archive_write_set_options(paVar2,"zip:experimental");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͦ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_options(a, \"zip:experimental\")",paVar2);
    iVar1 = archive_write_open_memory(paVar2,buff,1000000,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͨ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, buffsize, &used)",paVar2);
    write_contents(paVar2);
    dumpfile("constructed.zip",buff,local_38);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                     ,L'Ͱ',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͱ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ͳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar2);
    iVar1 = archive_read_add_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ʹ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password1234\")",paVar2);
    iVar1 = archive_read_open_memory(paVar2,buff,local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'͵',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                        paVar2);
    verify_contents(paVar2,1,1);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                     ,L'͹',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͻ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar2);
    iVar1 = archive_read_add_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ͽ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password1234\")",paVar2);
    iVar1 = read_open_memory(paVar2,buff,local_38,7);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 7)",
                        paVar2);
    verify_contents(paVar2,0,1);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                     ,L'΂',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'΃',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'΄',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar2);
    iVar1 = archive_read_add_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ά',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password1234\")",paVar2);
    iVar1 = read_open_memory(paVar2,buff,local_38,7);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'·',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 7)",
                        paVar2);
    verify_contents(paVar2,0,0);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                     ,L'Ό',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'΍',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ύ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar2);
    iVar1 = archive_read_add_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'ΐ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password1234\")",paVar2);
    iVar1 = read_open_memory_seek(paVar2,buff,local_38,7);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Α',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                        paVar2);
    verify_contents(paVar2,1,1);
    paVar2 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                     ,L'Δ',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ε',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar2);
    iVar1 = archive_read_support_filter_all(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ζ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar2);
    iVar1 = archive_read_add_passphrase(paVar2,"password1234");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Θ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_add_passphrase(a, \"password1234\")",paVar2);
    iVar1 = read_open_memory_seek(paVar2,buff,local_38,7);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                        ,L'Ι',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                        paVar2);
    verify_contents(paVar2,1,0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'͞');
    test_skipping("This system does not have cryptographic library");
    archive_write_free(paVar2);
  }
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_winzip_aes256_encryption)
{
	struct archive *a;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	if (ARCHIVE_OK != archive_write_set_options(a, "zip:encryption=aes256"))
	{
		skipping("This system does not have cryptographic library");
		archive_write_free(a);
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));
	write_contents(a);
	dumpfile("constructed.zip", buff, used);

	/*
	 * Now, read the data back.
	 */
	/* With the standard memory reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_add_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));
	verify_contents(a, 1, 1);

	/* With the test memory reader -- streaming mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_add_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 7));
	/* Streaming reader doesn't see mode information from Central Directory. */
	verify_contents(a, 0, 1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_add_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 7));
	/* Streaming reader doesn't see mode information from Central Directory. */
	verify_contents(a, 0, 0);

	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_add_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));
	verify_contents(a, 1, 1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_add_passphrase(a, "password1234"));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));
	verify_contents(a, 1, 0);

	free(buff);
}